

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result wabt::interp::Match(GlobalType *expected,GlobalType *actual,string *out_msg)

{
  char *pcVar1;
  char *pcVar2;
  char *format;
  string local_40;
  
  if (actual->mut == expected->mut) {
    local_40._M_dataplus._M_p._0_4_ = *(int *)&(expected->super_ExternType).field_0xc;
    if (*(int *)&(actual->super_ExternType).field_0xc == (int)local_40._M_dataplus._M_p) {
      return (Result)Ok;
    }
    pcVar1 = Type::GetName((Type *)&local_40);
    local_40._M_dataplus._M_p._0_4_ = *(int *)&(actual->super_ExternType).field_0xc;
    pcVar2 = Type::GetName((Type *)&local_40);
    format = "type mismatch in imported global, expected %s but got %s.";
  }
  else {
    pcVar1 = GetName::kNames[(int)actual->mut];
    pcVar2 = GetName::kNames[(int)expected->mut];
    format = "mutability mismatch in imported global, expected %s but got %s.";
  }
  StringPrintf_abi_cxx11_(&local_40,format,pcVar1,pcVar2);
  std::__cxx11::string::operator=((string *)out_msg,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(int)local_40._M_dataplus._M_p) !=
      &local_40.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_40._M_dataplus._M_p._4_4_,(int)local_40._M_dataplus._M_p));
  }
  return (Result)Error;
}

Assistant:

Result Match(const GlobalType& expected,
             const GlobalType& actual,
             std::string* out_msg) {
  if (actual.mut != expected.mut) {
    *out_msg = StringPrintf(
        "mutability mismatch in imported global, expected %s but got %s.",
        GetName(actual.mut), GetName(expected.mut));
    return Result::Error;
  }

  if (actual.type != expected.type &&
      (expected.mut == Mutability::Var ||
       !TypesMatch(expected.type, actual.type))) {
    *out_msg = StringPrintf(
        "type mismatch in imported global, expected %s but got %s.",
        GetName(expected.type), GetName(actual.type));
    return Result::Error;
  }

  return Result::Ok;
}